

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclLibUtil.c
# Opt level: O0

void Abc_SclTimingUpdate(SC_Cell *pCell,SC_Timing *p,char *Buffer)

{
  int iVar1;
  undefined8 *puVar2;
  char *pcVar3;
  int local_2c;
  int i;
  SC_Pin *pPin;
  char *Buffer_local;
  SC_Timing *p_local;
  SC_Cell *pCell_local;
  
  for (local_2c = 0; local_2c < pCell->n_inputs; local_2c = local_2c + 1) {
    puVar2 = (undefined8 *)Vec_PtrEntry(&pCell->vPins,local_2c);
    if ((p->related_pin != (char *)0x0) &&
       (iVar1 = strcmp(p->related_pin,(char *)*puVar2), iVar1 == 0)) {
      if (p->related_pin != (char *)0x0) {
        free(p->related_pin);
        p->related_pin = (char *)0x0;
      }
      sprintf(Buffer,"%c",(ulong)(local_2c + 0x61));
      pcVar3 = Abc_UtilStrsav(Buffer);
      p->related_pin = pcVar3;
    }
  }
  return;
}

Assistant:

static inline void Abc_SclTimingUpdate( SC_Cell * pCell, SC_Timing * p, char * Buffer )
{
    SC_Pin * pPin; int i;
    SC_CellForEachPinIn( pCell, pPin, i )
        if ( p->related_pin && !strcmp(p->related_pin, pPin->pName) )
        {
            ABC_FREE( p->related_pin );
            sprintf( Buffer, "%c", 'a'+i );
            p->related_pin = Abc_UtilStrsav( Buffer );
        }
}